

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_packet.cxx
# Opt level: O2

char * __thiscall xray_re::xr_packet::skip_sz(xr_packet *this)

{
  uint8_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = this->m_r_pos;
  uVar3 = uVar2;
  do {
    if (0xfff < uVar3) {
      __assert_fail("m_r_pos < sizeof(m_buf)",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_packet.cxx"
                    ,0x4f,"const char *xray_re::xr_packet::skip_sz()");
    }
    this->m_r_pos = uVar3 + 1;
    puVar1 = this->m_buf + uVar3;
    uVar3 = uVar3 + 1;
  } while (*puVar1 != '\0');
  return (char *)(this->m_buf + uVar2);
}

Assistant:

const char* xr_packet::skip_sz()
{
	const char* p = reinterpret_cast<const char*>(m_buf + m_r_pos);
	while (m_r_pos < sizeof(m_buf)) {
		if (m_buf[m_r_pos++] == 0)
			return p;
	}
	// crash in debug mode if no 0 in the packet
	xr_assert(m_r_pos < sizeof(m_buf));
	return p;
}